

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

bool __thiscall
ViconCGStreamIO::VBuffer::Read<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob>
          (VBuffer *this,
          vector<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob,_std::allocator<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob>_>
          *o_rValues)

{
  bool bVar1;
  VGreyscaleBlobs_GreyscaleBlob *local_38;
  uint local_24;
  vector<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob,_std::allocator<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob>_>
  *pvStack_20;
  UInt32 Size;
  vector<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob,_std::allocator<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob>_>
  *o_rValues_local;
  VBuffer *this_local;
  
  pvStack_20 = o_rValues;
  o_rValues_local =
       (vector<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob,_std::allocator<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob>_>
        *)this;
  std::
  vector<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob,_std::allocator<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob>_>
  ::clear(o_rValues);
  local_24 = 0;
  bVar1 = VBufferImpl::ReadPod<unsigned_int>(&this->m_BufferImpl,&local_24);
  if (bVar1) {
    std::
    vector<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob,_std::allocator<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob>_>
    ::resize(pvStack_20,(ulong)local_24);
    bVar1 = std::
            vector<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob,_std::allocator<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob>_>
            ::empty(pvStack_20);
    if (bVar1) {
      local_38 = (VGreyscaleBlobs_GreyscaleBlob *)0x0;
    }
    else {
      local_38 = std::
                 vector<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob,_std::allocator<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob>_>
                 ::operator[](pvStack_20,0);
    }
    this_local._7_1_ =
         VBufferDetail<0>::Read<ViconCGStreamDetail::VGreyscaleBlobs_GreyscaleBlob>
                   (&this->m_BufferImpl,local_38,local_24);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Read( std::vector< T > & o_rValues ) const
  {
    o_rValues.clear();
    ViconCGStreamType::UInt32 Size = 0;
    if( !m_BufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    o_rValues.resize( Size );
    return VBufferDetail< VIsPod< T >::Answer >::Read( m_BufferImpl, o_rValues.empty() ? 0 : &o_rValues[ 0 ], Size );
  }